

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

bool __thiscall
Protocol::MQTT::V5::Properties::checkPropertiesFor(Properties *this,ControlPacketType type)

{
  ushort uVar1;
  int iVar2;
  PropertyBase *pPVar3;
  bool bVar4;
  
  uVar1 = (this->length).size;
  if (((((ushort)(uVar1 - 1) < 4) && (-1 < (char)(this->length).field_0.value[uVar1 - 1])) &&
      (this->head != (PropertyBase *)0x0)) &&
     (iVar2 = (*(this->head->super_Serializable)._vptr_Serializable[4])(), (char)iVar2 == '\0')) {
LAB_00107135:
    bVar4 = false;
  }
  else {
    pPVar3 = this->head;
    bVar4 = pPVar3 == (PropertyBase *)0x0;
    if (!bVar4) {
      do {
        if (((byte)(pPVar3->type - 0x2b) < 0xd6) ||
           ((1 << ((byte)type & 0x1f) &
            (uint)*(ushort *)
                   (isAllowedProperty(Protocol::MQTT::V5::PropertyType,Protocol::MQTT::Common::ControlPacketType)
                    ::allowedProperties + (ulong)(pPVar3->type - 1) * 2)) == 0)) goto LAB_00107135;
        pPVar3 = pPVar3->next;
        bVar4 = pPVar3 == (PropertyBase *)0x0;
      } while (!bVar4);
    }
  }
  return bVar4;
}

Assistant:

bool checkPropertiesFor(const ControlPacketType type) const
                {
                    if (!check()) return false;
                    PropertyBase * u = head;
                    while (u) { if (!isAllowedProperty((PropertyType)u->type, type)) return false; u = u->next; }
                    return true;
                }